

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

parser_error parse_buy(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  undefined8 *puVar4;
  char *name;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    puVar4 = (undefined8 *)mem_zalloc(0x18);
    name = parser_getstr(p,"base");
    wVar1 = tval_find_idx(name);
    puVar4[1] = (long)wVar1;
    *puVar4 = *(undefined8 *)((long)pvVar3 + 0x78);
    *(undefined8 **)((long)pvVar3 + 0x78) = puVar4;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_buy(struct parser *p) {
	struct store *s = parser_priv(p);
	struct object_buy *buy;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	buy = mem_zalloc(sizeof(*buy));
	buy->tval = tval_find_idx(parser_getstr(p, "base"));
	buy->next = s->buy;
	s->buy = buy;
	return PARSE_ERROR_NONE;
}